

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_bench.cc
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
threadpool::partition
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          threadpool *this,uint64_t n)

{
  int iVar1;
  reference pvVar2;
  long lVar3;
  value_type vVar4;
  int local_48;
  int i;
  allocator<unsigned_long> local_32;
  undefined1 local_31;
  ulong local_30;
  uint64_t remainder;
  uint64_t quotient;
  uint64_t n_local;
  threadpool *this_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *blocks;
  
  remainder = n / (ulong)(long)this->num_threads;
  local_30 = n % (ulong)(long)this->num_threads;
  local_31 = 0;
  iVar1 = this->num_threads;
  quotient = n;
  n_local = (uint64_t)this;
  this_local = (threadpool *)__return_storage_ptr__;
  std::allocator<unsigned_long>::allocator(&local_32);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,(long)(iVar1 + 1),&local_32);
  std::allocator<unsigned_long>::~allocator(&local_32);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (__return_storage_ptr__,0);
  *pvVar2 = 0;
  for (local_48 = 1; local_48 < this->num_threads + 1; local_48 = local_48 + 1) {
    if (local_30 == 0) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (__return_storage_ptr__,(long)(local_48 + -1));
      vVar4 = *pvVar2 + remainder;
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (__return_storage_ptr__,(long)local_48);
      *pvVar2 = vVar4;
    }
    else {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (__return_storage_ptr__,(long)(local_48 + -1));
      lVar3 = *pvVar2 + remainder;
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (__return_storage_ptr__,(long)local_48);
      *pvVar2 = lVar3 + 1;
      local_30 = local_30 - 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< uint64_t > partition(uint64_t n) {
        uint64_t quotient = n / num_threads;
        uint64_t remainder = n % num_threads;

        std::vector< uint64_t > blocks(num_threads + 1);
        blocks[0] = 0;
        for (int i = 1; i < num_threads + 1; i++) {
            if (remainder > 0) {
                blocks[i] = blocks[i-1] + quotient + 1;
                remainder--;
            } else {
                blocks[i] = blocks[i-1] + quotient;
            }
        }
        return blocks;
    }